

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void __thiscall ncnn::Mat::clone_from(Mat *this,Mat *mat,Allocator *allocator)

{
  int in_ECX;
  void *in_R8;
  Mat MStack_58;
  
  clone(&MStack_58,(__fn *)mat,allocator,in_ECX,in_R8);
  operator=(this,&MStack_58);
  ~Mat(&MStack_58);
  return;
}

Assistant:

void Mat::clone_from(const ncnn::Mat& mat, Allocator* allocator)
{
    *this = mat.clone(allocator);
}